

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

word Z80::GetWordNoMem(char **p)

{
  char *badValueMessage;
  int iVar1;
  char *oldP;
  char **ppcStack_18;
  aint val;
  char **p_local;
  
  ppcStack_18 = p;
  if ((int)DAT_001e16a8 == 0) {
    p_local._6_2_ = GetWord(p);
  }
  else {
    badValueMessage = *p;
    iVar1 = ParseExpressionMemAccess(p,(aint *)((long)&oldP + 4));
    if (iVar1 == 1) {
      check16(oldP._4_4_);
      p_local._6_2_ = (word)oldP._4_4_;
    }
    else if (iVar1 == 2) {
      Error("Illegal instruction (can\'t access memory)",badValueMessage,PASS3);
      p_local._6_2_ = 0;
    }
    else {
      Error("Operand expected",badValueMessage,IF_FIRST);
      p_local._6_2_ = 0;
    }
  }
  return p_local._6_2_;
}

Assistant:

static word GetWordNoMem(char*& p) {
		if (0 == Options::syx.MemoryBrackets) return GetWord(p); // legacy behaviour => don't care
		aint val; char* const oldP = p;
		switch (ParseExpressionMemAccess(p, val)) {
		case 1:					// valid constant (not a memory access) => return value
			check16(val);
			return val & 65535;
		case 2:					// valid memory access => report error
			Error("Illegal instruction (can't access memory)", oldP);
			return 0;
		default:				// parsing failed, report syntax error
			Error("Operand expected", oldP, IF_FIRST);
			return 0;
		}
	}